

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component,
          Deduplicator *deduplicator)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int __errnum;
  DeduplicateStatus DVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  ulong uVar7;
  string local_be0 [32];
  string local_bc0;
  undefined1 local_ba0 [8];
  ostringstream cmCPackLog_msg_5;
  string local_a28 [32];
  undefined1 local_a08 [8];
  ostringstream cmCPackLog_msg_4;
  string local_890 [32];
  undefined1 local_870 [8];
  ostringstream cmCPackLog_msg_3;
  string local_6f8;
  string local_6d8 [32];
  undefined1 local_6b8 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_538 [4];
  DeduplicateStatus status;
  string rp;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_4d1;
  string local_4d0;
  cmValue local_4b0;
  cmValue installPrefix;
  string local_4a0;
  cmValue local_480;
  string local_478;
  allocator<char> local_451;
  string local_450;
  undefined1 local_430 [8];
  string filePrefix;
  string local_408 [32];
  undefined1 local_3e8 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_270 [8];
  cmWorkingDirectory workdir;
  allocator<char> local_221;
  string local_220;
  cmValue local_200;
  undefined1 local_1f8 [8];
  string localToplevel;
  ostringstream local_1a8 [8];
  ostringstream cmCPackLog_msg;
  Deduplicator *deduplicator_local;
  cmCPackComponent *component_local;
  cmArchiveWrite *archive_local;
  cmCPackArchiveGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,"   - packaging component: ");
  poVar4 = std::operator<<(poVar4,(string *)component);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xea,pcVar5);
  std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"CPACK_TEMPORARY_DIRECTORY",&local_221);
  local_200 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_220);
  psVar6 = cmValue::operator_cast_to_string_(&local_200);
  std::__cxx11::string::string((string *)local_1f8,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &workdir.ResultCode,"/",&component->Name);
  std::__cxx11::string::operator+=((string *)local_1f8,(string *)&workdir.ResultCode);
  std::__cxx11::string::~string((string *)&workdir.ResultCode);
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_270,(string *)local_1f8);
  bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_270);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar4 = std::operator<<((ostream *)local_3e8,"Failed to change working directory to ");
    poVar4 = std::operator<<(poVar4,(string *)local_1f8);
    poVar4 = std::operator<<(poVar4," : ");
    __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_270);
    pcVar5 = strerror(__errnum);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xf4,pcVar5);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
    this_local._4_4_ = 0;
    filePrefix.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_430);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",&local_451);
    bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,"CPACK_PACKAGE_FILE_NAME",
                 (allocator<char> *)((long)&installPrefix.Value + 7));
      local_480 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4a0);
      installPrefix.Value._6_1_ = 0x2f;
      cmStrCat<cmValue,char>(&local_478,&local_480,(char *)((long)&installPrefix.Value + 6));
      std::__cxx11::string::operator=((string *)local_430,(string *)&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix.Value + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"CPACK_PACKAGING_INSTALL_PREFIX",&local_4d1);
    local_4b0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    bVar2 = cmValue::operator_cast_to_bool(&local_4b0);
    if (bVar2) {
      cmValue::operator->[abi_cxx11_(&local_4b0);
      uVar7 = std::__cxx11::string::size();
      if (1 < uVar7) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_4b0);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
        if (*pcVar5 == '/') {
          psVar6 = cmValue::operator->[abi_cxx11_(&local_4b0);
          std::__cxx11::string::substr((ulong)&__range1,(ulong)psVar6);
          std::__cxx11::string::operator+=((string *)local_430,(string *)&__range1);
          std::__cxx11::string::~string((string *)&__range1);
          std::__cxx11::string::operator+=((string *)local_430,"/");
        }
      }
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&component->Files);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&component->Files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      rp.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rp.field_2._8_8_);
      if ((deduplicator == (Deduplicator *)0x0) ||
         (DVar3 = Deduplicator::IsDeduplicate(deduplicator,(string *)local_538,(string *)local_1f8),
         DVar3 == Add)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
        poVar4 = std::operator<<((ostream *)local_6b8,"Adding file: ");
        poVar4 = std::operator<<(poVar4,(string *)local_538);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x10b,pcVar5);
        std::__cxx11::string::~string(local_6d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
        std::__cxx11::string::string((string *)&local_6f8,(string *)local_538);
        cmArchiveWrite::Add(archive,&local_6f8,0,(char *)0x0,false);
        std::__cxx11::string::~string((string *)&local_6f8);
LAB_002240f8:
        bVar2 = cmArchiveWrite::operator!(archive);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ba0);
          poVar4 = std::operator<<((ostream *)local_ba0,"ERROR while packaging files: ");
          cmArchiveWrite::GetError_abi_cxx11_(&local_bc0,archive);
          poVar4 = std::operator<<(poVar4,(string *)&local_bc0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_bc0);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x11a,pcVar5);
          std::__cxx11::string::~string(local_be0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ba0);
          this_local._4_4_ = 0;
          filePrefix.field_2._12_4_ = 1;
        }
        else {
          filePrefix.field_2._12_4_ = 0;
        }
      }
      else {
        if (DVar3 != Error) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a08);
          poVar4 = std::operator<<((ostream *)local_a08,"Passing file: ");
          poVar4 = std::operator<<(poVar4,(string *)local_538);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x114,pcVar5);
          std::__cxx11::string::~string(local_a28);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a08);
          goto LAB_002240f8;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
        std::operator<<((ostream *)local_870,
                        "ERROR The data in files with the same filename is different.");
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x110,pcVar5);
        std::__cxx11::string::~string(local_890);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
        this_local._4_4_ = 0;
        filePrefix.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_538);
      if (filePrefix.field_2._12_4_ != 0) goto LAB_002242cc;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = 1;
    filePrefix.field_2._12_4_ = 1;
LAB_002242cc:
    std::__cxx11::string::~string((string *)local_430);
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_270);
  std::__cxx11::string::~string((string *)local_1f8);
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(
  cmArchiveWrite& archive, cmCPackComponent* component,
  Deduplicator* deduplicator)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "   - packaging component: " << component->Name << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/" + component->Name;
  // Change to local toplevel
  cmWorkingDirectory workdir(localToplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << localToplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
    filePrefix = cmStrCat(this->GetOption("CPACK_PACKAGE_FILE_NAME"), '/');
  }
  cmValue installPrefix = this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if (installPrefix && installPrefix->size() > 1 &&
      (*installPrefix)[0] == '/') {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix->substr(1);
    filePrefix += "/";
  }
  for (std::string const& file : component->Files) {
    std::string rp = filePrefix + file;

    DeduplicateStatus status = DeduplicateStatus::Add;
    if (deduplicator != nullptr) {
      status = deduplicator->IsDeduplicate(rp, localToplevel);
    }

    if (deduplicator == nullptr || status == DeduplicateStatus::Add) {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Adding file: " << rp << std::endl);
      archive.Add(rp, 0, nullptr, false);
    } else if (status == DeduplicateStatus::Error) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR The data in files with the "
                    "same filename is different.");
      return 0;
    } else {
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Passing file: " << rp << std::endl);
    }

    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR while packaging files: " << archive.GetError()
                                                    << std::endl);
      return 0;
    }
  }
  return 1;
}